

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_NtkFindRoots(Acb_Ntk_t *p,Vec_Int_t *vTargets,Vec_Bit_t **pvBlock)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Vec_Bit_t *vBlock;
  Vec_Int_t *vRoots;
  int iObj;
  int i;
  Vec_Bit_t **pvBlock_local;
  Vec_Int_t *vTargets_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Acb_NtkObjNum(p);
  p_01 = Vec_BitStart(iVar1);
  *pvBlock = p_01;
  Acb_NtkIncTravId(p);
  iVar1 = Vec_IntSize(vTargets);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(vTargets) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0x1d9,"Vec_Int_t *Acb_NtkFindRoots(Acb_Ntk_t *, Vec_Int_t *, Vec_Bit_t **)");
  }
  for (vRoots._4_4_ = 0; iVar1 = Vec_IntSize(vTargets), vRoots._4_4_ < iVar1;
      vRoots._4_4_ = vRoots._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vTargets,vRoots._4_4_);
    Acb_ObjSetTravIdCur(p,iVar1);
    Vec_BitWriteEntry(p_01,iVar1,1);
  }
  Acb_NtkIncTravId(p);
  for (vRoots._4_4_ = 0; iVar1 = Acb_NtkCiNum(p), vRoots._4_4_ < iVar1;
      vRoots._4_4_ = vRoots._4_4_ + 1) {
    iVar1 = Acb_NtkCi(p,vRoots._4_4_);
    Acb_ObjSetTravIdCur(p,iVar1);
  }
  for (vRoots._4_4_ = 0; iVar1 = Acb_NtkCoNum(p), vRoots._4_4_ < iVar1;
      vRoots._4_4_ = vRoots._4_4_ + 1) {
    iVar1 = Acb_NtkCo(p,vRoots._4_4_);
    iVar1 = Acb_ObjFanin(p,iVar1,0);
    iVar1 = Acb_NtkFindRoots_rec(p,iVar1,p_01);
    if (iVar1 != 0) {
      Vec_IntPush(p_00,vRoots._4_4_);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindRoots( Acb_Ntk_t * p, Vec_Int_t * vTargets, Vec_Bit_t ** pvBlock )
{
    int i, iObj;
    Vec_Int_t * vRoots = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vBlock = Vec_BitStart( Acb_NtkObjNum(p) );
    *pvBlock = vBlock;
    // mark targets
    Acb_NtkIncTravId( p );
    assert( Vec_IntSize(vTargets) > 0 );
    Vec_IntForEachEntry( vTargets, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        Vec_BitWriteEntry( vBlock, iObj, 1 );
    }
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetTravIdCur( p, iObj );
    // collect outputs reachable from targets
    Acb_NtkForEachCoDriver( p, iObj, i )
        if ( Acb_NtkFindRoots_rec(p, iObj, vBlock) )
            Vec_IntPush( vRoots, i );
    //Vec_IntPrint( vRoots );
    return vRoots;
}